

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall icu_63::RBBITableBuilder::calcFollowPos(RBBITableBuilder *this,RBBINode *n)

{
  NodeType NVar1;
  void *pvVar2;
  uint uVar3;
  UVector *pUVar4;
  
  if (((n != (RBBINode *)0x0) && (n->fType != leafChar)) && (n->fType != endMark)) {
    calcFollowPos(this,n->fLeftChild);
    calcFollowPos(this,n->fRightChild);
    NVar1 = n->fType;
    if (NVar1 == opCat) {
      pUVar4 = n->fLeftChild->fLastPosSet;
      if (pUVar4->count == 0) {
        return;
      }
      uVar3 = 0;
      do {
        pvVar2 = UVector::elementAt(pUVar4,uVar3);
        setAdd(this,*(UVector **)((long)pvVar2 + 0x98),n->fRightChild->fFirstPosSet);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (uint)pUVar4->count);
      NVar1 = n->fType;
    }
    if (((NVar1 & ~uset) == opStar) && (pUVar4 = n->fLastPosSet, pUVar4->count != 0)) {
      uVar3 = 0;
      do {
        pvVar2 = UVector::elementAt(pUVar4,uVar3);
        setAdd(this,*(UVector **)((long)pvVar2 + 0x98),n->fFirstPosSet);
        uVar3 = uVar3 + 1;
        pUVar4 = n->fLastPosSet;
      } while (uVar3 < (uint)pUVar4->count);
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::calcFollowPos(RBBINode *n) {
    if (n == NULL ||
        n->fType == RBBINode::leafChar ||
        n->fType == RBBINode::endMark) {
        return;
    }

    calcFollowPos(n->fLeftChild);
    calcFollowPos(n->fRightChild);

    // Aho rule #1
    if (n->fType == RBBINode::opCat) {
        RBBINode *i;   // is 'i' in Aho's description
        uint32_t     ix;

        UVector *LastPosOfLeftChild = n->fLeftChild->fLastPosSet;

        for (ix=0; ix<(uint32_t)LastPosOfLeftChild->size(); ix++) {
            i = (RBBINode *)LastPosOfLeftChild->elementAt(ix);
            setAdd(i->fFollowPos, n->fRightChild->fFirstPosSet);
        }
    }

    // Aho rule #2
    if (n->fType == RBBINode::opStar ||
        n->fType == RBBINode::opPlus) {
        RBBINode   *i;  // again, n and i are the names from Aho's description.
        uint32_t    ix;

        for (ix=0; ix<(uint32_t)n->fLastPosSet->size(); ix++) {
            i = (RBBINode *)n->fLastPosSet->elementAt(ix);
            setAdd(i->fFollowPos, n->fFirstPosSet);
        }
    }



}